

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_opt_getNextMatchAndUpdateSeqStore
               (ZSTD_optLdm_t *optLdm,U32 currPosInBlock,U32 blockBytesRemaining)

{
  U32 UVar1;
  ulong uVar2;
  rawSeq *prVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar6 = (optLdm->seqStore).size;
  if ((uVar6 == 0) || (uVar2 = (optLdm->seqStore).pos, uVar6 <= uVar2)) {
    optLdm->startPosInBlock = 0xffffffff;
    optLdm->endPosInBlock = 0xffffffff;
    return;
  }
  prVar3 = (optLdm->seqStore).seq;
  uVar6 = (optLdm->seqStore).posInSequence;
  uVar7 = prVar3[uVar2].litLength;
  if (prVar3[uVar2].matchLength + uVar7 < uVar6) {
    __assert_fail("optLdm->seqStore.posInSequence <= currSeq.litLength + currSeq.matchLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x82d5,"void ZSTD_opt_getNextMatchAndUpdateSeqStore(ZSTD_optLdm_t *, U32, U32)");
  }
  uVar4 = uVar7 - (int)uVar6;
  uVar8 = 0;
  if (uVar6 < uVar7) {
    uVar8 = uVar4;
  }
  if (uVar8 != 0) {
    uVar4 = 0;
  }
  if (uVar8 < blockBytesRemaining) {
    UVar1 = prVar3[uVar2].offset;
    iVar5 = uVar4 + prVar3[uVar2].matchLength;
    optLdm->startPosInBlock = currPosInBlock + uVar8;
    uVar7 = currPosInBlock + uVar8 + iVar5;
    optLdm->endPosInBlock = uVar7;
    optLdm->offset = UVar1;
    if (uVar7 <= blockBytesRemaining + currPosInBlock) {
      uVar6 = (ulong)(iVar5 + uVar8);
      goto LAB_0019fc17;
    }
    optLdm->endPosInBlock = blockBytesRemaining + currPosInBlock;
  }
  else {
    optLdm->startPosInBlock = 0xffffffff;
    optLdm->endPosInBlock = 0xffffffff;
  }
  uVar6 = (ulong)blockBytesRemaining;
LAB_0019fc17:
  ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore,uVar6);
  return;
}

Assistant:

static void
ZSTD_opt_getNextMatchAndUpdateSeqStore(ZSTD_optLdm_t* optLdm, U32 currPosInBlock,
                                       U32 blockBytesRemaining)
{
    rawSeq currSeq;
    U32 currBlockEndPos;
    U32 literalsBytesRemaining;
    U32 matchBytesRemaining;

    /* Setting match end position to MAX to ensure we never use an LDM during this block */
    if (optLdm->seqStore.size == 0 || optLdm->seqStore.pos >= optLdm->seqStore.size) {
        optLdm->startPosInBlock = UINT_MAX;
        optLdm->endPosInBlock = UINT_MAX;
        return;
    }
    /* Calculate appropriate bytes left in matchLength and litLength
     * after adjusting based on ldmSeqStore->posInSequence */
    currSeq = optLdm->seqStore.seq[optLdm->seqStore.pos];
    assert(optLdm->seqStore.posInSequence <= currSeq.litLength + currSeq.matchLength);
    currBlockEndPos = currPosInBlock + blockBytesRemaining;
    literalsBytesRemaining = (optLdm->seqStore.posInSequence < currSeq.litLength) ?
            currSeq.litLength - (U32)optLdm->seqStore.posInSequence :
            0;
    matchBytesRemaining = (literalsBytesRemaining == 0) ?
            currSeq.matchLength - ((U32)optLdm->seqStore.posInSequence - currSeq.litLength) :
            currSeq.matchLength;

    /* If there are more literal bytes than bytes remaining in block, no ldm is possible */
    if (literalsBytesRemaining >= blockBytesRemaining) {
        optLdm->startPosInBlock = UINT_MAX;
        optLdm->endPosInBlock = UINT_MAX;
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, blockBytesRemaining);
        return;
    }

    /* Matches may be < MINMATCH by this process. In that case, we will reject them
       when we are deciding whether or not to add the ldm */
    optLdm->startPosInBlock = currPosInBlock + literalsBytesRemaining;
    optLdm->endPosInBlock = optLdm->startPosInBlock + matchBytesRemaining;
    optLdm->offset = currSeq.offset;

    if (optLdm->endPosInBlock > currBlockEndPos) {
        /* Match ends after the block ends, we can't use the whole match */
        optLdm->endPosInBlock = currBlockEndPos;
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, currBlockEndPos - currPosInBlock);
    } else {
        /* Consume nb of bytes equal to size of sequence left */
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, literalsBytesRemaining + matchBytesRemaining);
    }
}